

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string *psVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  raw_ostream *prVar6;
  AnnotationOptsT AVar7;
  char *Str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  StringRef SVar8;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  ModuleAnnotator annotator;
  ModuleWriter writer;
  DGDumper dumper;
  LLVMContext context;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> criteria_nodes;
  _Base_ptr local_588;
  _Base_ptr p_Stack_580;
  _Base_ptr local_578;
  code *local_570;
  SlicerOptions options;
  Slicer slicer;
  
  setupStackTraceOnError(argc,argv);
  local_588 = (_Base_ptr)0x0;
  p_Stack_580 = (_Base_ptr)0x0;
  local_570 = std::
              _Function_handler<void_(llvm::raw_ostream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/tools/llvm-slicer.cpp:140:33)>
              ::_M_invoke;
  local_578 = (_Base_ptr)
              std::
              _Function_handler<void_(llvm::raw_ostream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/tools/llvm-slicer.cpp:140:33)>
              ::_M_manager;
  llvm::cl::SetVersionPrinter(&local_588);
  if (local_578 != (_Base_ptr)0x0) {
    (*(code *)local_578)(&local_588,&local_588,3);
  }
  iVar4 = 1;
  parseSlicerOptions((int)&options,(char **)(ulong)(uint)argc,SUB81(argv,0),true);
  if (dump_dg_only[0x80] == '\x01') {
    slicer.M._0_1_ = 1;
    llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::operator=
              ((opt<bool,false,llvm::cl::parser<bool>> *)dump_dg,(bool *)&slicer);
  }
  llvm::LLVMContext::LLVMContext(&context);
  parseModule((char *)&M,(LLVMContext *)"llvm-slicer",(SlicerOptions *)&context);
  if ((__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)
      M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)0x0) goto LAB_0012862b;
  psVar1 = &options.dgOptions.entryFunction;
  SVar8.Length = (size_t)options.dgOptions.entryFunction._M_dataplus._M_p;
  SVar8.Data = (char *)M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl;
  lVar5 = llvm::Module::getFunction(SVar8);
  if (lVar5 == 0) {
    prVar6 = (raw_ostream *)llvm::errs();
    prVar6 = llvm::raw_ostream::operator<<(prVar6,"The entry function not found: ");
    prVar6 = llvm::raw_ostream::operator<<(prVar6,psVar1);
    llvm::raw_ostream::operator<<(prVar6,"\n");
    goto LAB_0012862b;
  }
  maybe_print_statistics
            ((Module *)
             M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
             super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
             super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,"Statistics before ");
  writer.M = (Module *)
             M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
             super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
             super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl;
  writer.options = &options;
  ModuleWriter::removeUnusedFromModule(&writer);
  if (remove_unused_only[0x80] == '\x01') {
    prVar6 = (raw_ostream *)llvm::errs();
    llvm::raw_ostream::operator<<
              (prVar6,"[llvm-slicer] removed unused parts of module, exiting...\n");
    maybe_print_statistics
              ((Module *)
               M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
               super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
               super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,"Statistics after ");
    iVar4 = ModuleWriter::saveModule(&writer,(bool)should_verify_module[0x80]);
    goto LAB_0012862b;
  }
  if ((options.cutoffDiverging == true) && (options.dgOptions.threads == true)) {
    prVar6 = (raw_ostream *)llvm::errs();
    llvm::raw_ostream::operator<<
              (prVar6,"[llvm-slicer] threads are enabled, not cutting off diverging\n");
    options.cutoffDiverging = false;
  }
  else if (options.cutoffDiverging != false) {
    getSlicingCriteriaValues
              ((Module *)&criteria_nodes,
               (string *)
               M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
               super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
               super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,
               (string *)&options.slicingCriteria,(string *)&options.legacySlicingCriteria,
               (bool)((char)&options + '\x10'));
    if (criteria_nodes._M_t._M_impl._0_8_ ==
        CONCAT44(criteria_nodes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                 criteria_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color)) {
      prVar6 = (raw_ostream *)llvm::errs();
      prVar6 = llvm::raw_ostream::operator<<(prVar6,"No reachable slicing criteria: \'");
      prVar6 = llvm::raw_ostream::operator<<(prVar6,&options.slicingCriteria);
      prVar6 = llvm::raw_ostream::operator<<(prVar6,"\' \'");
      prVar6 = llvm::raw_ostream::operator<<(prVar6,&options.legacySlicingCriteria);
      llvm::raw_ostream::operator<<(prVar6,"\'\n");
      Slicer::Slicer(&slicer,(Module *)
                             M._M_t.
                             super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>
                             .super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,&options);
      bVar2 = Slicer::createEmptyMain(&slicer,false);
      if (bVar2) {
        maybe_print_statistics
                  ((Module *)
                   M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                   _M_t.super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                   super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,"Statistics after ");
        iVar4 = ModuleWriter::cleanAndSaveModule(&writer,(bool)should_verify_module[0x80]);
      }
      else {
        prVar6 = (raw_ostream *)llvm::errs();
        llvm::raw_ostream::operator<<(prVar6,"ERROR: failed creating an empty main\n");
        iVar4 = 1;
      }
      Slicer::~Slicer(&slicer);
LAB_0012820c:
      bVar2 = false;
    }
    else {
      cVar3 = dg::llvmdg::cutoffDivergingBranches
                        ((Module *)
                         M._M_t.
                         super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                         super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,(string *)psVar1,
                         (vector *)&criteria_nodes);
      if (cVar3 == '\0') {
        prVar6 = (raw_ostream *)llvm::errs();
        llvm::raw_ostream::operator<<
                  (prVar6,"[llvm-slicer]: Failed cutting off diverging branches\n");
        iVar4 = 1;
        goto LAB_0012820c;
      }
      maybe_print_statistics
                ((Module *)
                 M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t
                 .super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                 super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,
                 "Statistics after cutoff-diverging ");
      bVar2 = true;
      iVar4 = 0;
    }
    std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
              ((_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)
               &criteria_nodes);
    if (!bVar2) goto LAB_0012862b;
  }
  Slicer::Slicer(&slicer,(Module *)
                         M._M_t.
                         super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                         super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,&options);
  AVar7 = 0;
  bVar2 = Slicer::buildDG(&slicer,false);
  if (bVar2) {
    if (annotationOpts_abi_cxx11_._136_8_ != 0) {
      splitList((string *)&criteria_nodes,-8);
      AVar7 = 0;
      for (__lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   criteria_nodes._M_t._M_impl._0_8_;
          __lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(criteria_nodes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                            criteria_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
          __lhs = __lhs + 1) {
        bVar2 = std::operator==(__lhs,"dd");
        if (bVar2) {
          AVar7 = AVar7 | ANNOTATE_DD;
          goto LAB_001282e6;
        }
        bVar2 = std::operator==(__lhs,"cd");
        if (bVar2) {
LAB_001282e3:
          AVar7 = AVar7 | ANNOTATE_CD;
        }
        else {
          bVar2 = std::operator==(__lhs,"cda");
          if (bVar2) goto LAB_001282e3;
          bVar2 = std::operator==(__lhs,"dda");
          if (bVar2) {
LAB_00128312:
            AVar7 = AVar7 | ANNOTATE_DEF;
          }
          else {
            bVar2 = std::operator==(__lhs,"du");
            if (bVar2) goto LAB_00128312;
            bVar2 = std::operator==(__lhs,"pta");
            if (bVar2) {
              AVar7 = AVar7 | ANNOTATE_PTR;
            }
            else {
              bVar2 = std::operator==(__lhs,"memacc");
              if (bVar2) {
                AVar7 = AVar7 | ANNOTATE_MEMORYACC;
              }
              else {
                bVar2 = std::operator==(__lhs,"slice");
                if (!bVar2) {
                  bVar2 = std::operator==(__lhs,"sl");
                  if (!bVar2) {
                    bVar2 = std::operator==(__lhs,"slicer");
                    if (!bVar2) goto LAB_001282e6;
                  }
                }
                AVar7 = AVar7 | ANNOTATE_SLICE;
              }
            }
          }
        }
LAB_001282e6:
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&criteria_nodes);
    }
    criteria_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &criteria_nodes._M_t._M_impl.super__Rb_tree_header._M_header;
    criteria_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    criteria_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    criteria_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    psVar1 = &options.slicingCriteria;
    annotator.options = &options;
    annotator.annotationOptions = AVar7;
    criteria_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         criteria_nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    cVar3 = getSlicingCriteriaNodes
                      ((LLVMDependenceGraph *)
                       slicer._dg._M_t.
                       super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
                       .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl,
                       (string *)psVar1,(string *)&options.legacySlicingCriteria,
                       (string *)&options.legacySecondarySlicingCriteria,(set *)&criteria_nodes,
                       options.criteriaAreNextInstr);
    if (cVar3 == '\0') {
      prVar6 = (raw_ostream *)llvm::errs();
      prVar6 = llvm::raw_ostream::operator<<(prVar6,"ERROR: Failed finding slicing criteria: \'");
      prVar6 = llvm::raw_ostream::operator<<(prVar6,psVar1);
      llvm::raw_ostream::operator<<(prVar6,"\'\n");
      iVar4 = 1;
      if (annotator.annotationOptions != 0) {
        Slicer::computeDependencies(&slicer);
        ModuleAnnotator::annotate
                  (&annotator,
                   (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                    *)0x0);
      }
    }
    else {
      if (criteria_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        prVar6 = (raw_ostream *)llvm::errs();
        prVar6 = llvm::raw_ostream::operator<<(prVar6,"No reachable slicing criteria: \'");
        prVar6 = llvm::raw_ostream::operator<<(prVar6,psVar1);
        prVar6 = llvm::raw_ostream::operator<<(prVar6,"\' \'");
        prVar6 = llvm::raw_ostream::operator<<(prVar6,&options.legacySlicingCriteria);
        llvm::raw_ostream::operator<<(prVar6,"\'\n");
        if (annotator.annotationOptions != 0) {
          Slicer::computeDependencies(&slicer);
          ModuleAnnotator::annotate
                    (&annotator,
                     (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                      *)0x0);
        }
        bVar2 = Slicer::createEmptyMain(&slicer,false);
        if (bVar2) {
LAB_001285bb:
          maybe_print_statistics
                    ((Module *)
                     M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                     _M_t.super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>
                     .super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,"Statistics after ")
          ;
          iVar4 = ModuleWriter::cleanAndSaveModule(&writer,(bool)should_verify_module[0x80]);
          goto LAB_00128614;
        }
        prVar6 = (raw_ostream *)llvm::errs();
        Str = "ERROR: failed creating an empty main\n";
      }
      else {
        bVar2 = Slicer::mark(&slicer,&criteria_nodes);
        if (bVar2) {
          if (annotator.annotationOptions != 0) {
            ModuleAnnotator::annotate(&annotator,&criteria_nodes);
          }
          dumper.dg = (LLVMDependenceGraph *)
                      slicer._dg._M_t.
                      super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
                      .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl;
          dumper.bb_only = (bool)dump_bb_only[0x80];
          dumper.dump_opts = 0x154;
          dumper.options = &options;
          if (dump_dg[0x80] == '\x01') {
            iVar4 = 0;
            DGDumper::dumpToDot(&dumper,(char *)0x0);
            if (dump_dg_only[0x80] != '\0') goto LAB_00128614;
          }
          bVar2 = Slicer::slice(&slicer);
          if (bVar2) {
            if (dump_dg[0x80] == '\x01') {
              DGDumper::dumpToDot(&dumper,".sliced.dot");
            }
            goto LAB_001285bb;
          }
          prVar6 = (raw_ostream *)llvm::errs();
          Str = "ERROR: Slicing failed\n";
        }
        else {
          prVar6 = (raw_ostream *)llvm::errs();
          Str = "Finding dependent nodes failed\n";
        }
      }
      llvm::raw_ostream::operator<<(prVar6,Str);
      iVar4 = 1;
    }
LAB_00128614:
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::~_Rb_tree(&criteria_nodes._M_t);
  }
  else {
    prVar6 = (raw_ostream *)llvm::errs();
    llvm::raw_ostream::operator<<(prVar6,"ERROR: Failed building DG\n");
    iVar4 = 1;
  }
  Slicer::~Slicer(&slicer);
LAB_0012862b:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr(&M);
  llvm::LLVMContext::~LLVMContext(&context);
  SlicerOptions::~SlicerOptions(&options);
  return iVar4;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);

#if ((LLVM_VERSION_MAJOR >= 6))
    llvm::cl::SetVersionPrinter([](llvm::raw_ostream & /*unused*/) {
        printf("%s\n", GIT_VERSION);
    });
#else
    llvm::cl::SetVersionPrinter([]() { printf("%s\n", GIT_VERSION); });
#endif

    SlicerOptions options = parseSlicerOptions(argc, argv,
                                               /* requireCrit = */ true);

    if (enable_debug) {
        DBG_ENABLE();
    }

    // dump_dg_only implies dumg_dg
    if (dump_dg_only) {
        dump_dg = true;
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-slicer", context, options);
    if (!M)
        return 1;

    if (!M->getFunction(options.dgOptions.entryFunction)) {
        llvm::errs() << "The entry function not found: "
                     << options.dgOptions.entryFunction << "\n";
        return 1;
    }

    maybe_print_statistics(M.get(), "Statistics before ");

    // remove unused from module, we don't need that
    ModuleWriter writer(options, M.get());
    writer.removeUnusedFromModule();

    if (remove_unused_only) {
        errs() << "[llvm-slicer] removed unused parts of module, exiting...\n";
        maybe_print_statistics(M.get(), "Statistics after ");
        return writer.saveModule(should_verify_module);
    }

    /// ---------------
    // slice the code
    /// ---------------
    if (options.cutoffDiverging && options.dgOptions.threads) {
        llvm::errs() << "[llvm-slicer] threads are enabled, not cutting off "
                        "diverging\n";
        options.cutoffDiverging = false;
    }

    if (options.cutoffDiverging) {
        DBG(llvm - slicer, "Searching for slicing criteria values");
        auto csvalues = getSlicingCriteriaValues(
                *M, options.slicingCriteria, options.legacySlicingCriteria,
                options.legacySecondarySlicingCriteria,
                options.criteriaAreNextInstr);
        if (csvalues.empty()) {
            llvm::errs() << "No reachable slicing criteria: '"
                         << options.slicingCriteria << "' '"
                         << options.legacySlicingCriteria << "'\n";
            ::Slicer slicer(M.get(), options);
            if (!slicer.createEmptyMain()) {
                llvm::errs() << "ERROR: failed creating an empty main\n";
                return 1;
            }

            maybe_print_statistics(M.get(), "Statistics after ");
            return writer.cleanAndSaveModule(should_verify_module);
        }

        DBG(llvm - slicer, "Cutting off diverging branches");
        if (!llvmdg::cutoffDivergingBranches(
                    *M, options.dgOptions.entryFunction, csvalues)) {
            errs() << "[llvm-slicer]: Failed cutting off diverging branches\n";
            return 1;
        }

        maybe_print_statistics(M.get(), "Statistics after cutoff-diverging ");
    }

    ::Slicer slicer(M.get(), options);
    if (!slicer.buildDG()) {
        errs() << "ERROR: Failed building DG\n";
        return 1;
    }

    ModuleAnnotator annotator(options, &slicer.getDG(),
                              parseAnnotationOptions(annotationOpts));

    std::set<LLVMNode *> criteria_nodes;
    if (!getSlicingCriteriaNodes(slicer.getDG(), options.slicingCriteria,
                                 options.legacySlicingCriteria,
                                 options.legacySecondarySlicingCriteria,
                                 criteria_nodes,
                                 options.criteriaAreNextInstr)) {
        llvm::errs() << "ERROR: Failed finding slicing criteria: '"
                     << options.slicingCriteria << "'\n";

        if (annotator.shouldAnnotate()) {
            slicer.computeDependencies();
            annotator.annotate();
        }

        return 1;
    }

    if (criteria_nodes.empty()) {
        llvm::errs() << "No reachable slicing criteria: '"
                     << options.slicingCriteria << "' '"
                     << options.legacySlicingCriteria << "'\n";
        if (annotator.shouldAnnotate()) {
            slicer.computeDependencies();
            annotator.annotate();
        }

        if (!slicer.createEmptyMain()) {
            llvm::errs() << "ERROR: failed creating an empty main\n";
            return 1;
        }

        maybe_print_statistics(M.get(), "Statistics after ");
        return writer.cleanAndSaveModule(should_verify_module);
    }

    // mark nodes that are going to be in the slice
    if (!slicer.mark(criteria_nodes)) {
        llvm::errs() << "Finding dependent nodes failed\n";
        return 1;
    }

    // print debugging llvm IR if user asked for it
    if (annotator.shouldAnnotate())
        annotator.annotate(&criteria_nodes);

    DGDumper dumper(options, &slicer.getDG(), dump_bb_only);
    if (dump_dg) {
        dumper.dumpToDot();

        if (dump_dg_only)
            return 0;
    }

    // slice the graph
    if (!slicer.slice()) {
        errs() << "ERROR: Slicing failed\n";
        return 1;
    }

    if (dump_dg) {
        dumper.dumpToDot(".sliced.dot");
    }

    // remove unused from module again, since slicing
    // could and probably did make some other parts unused
    maybe_print_statistics(M.get(), "Statistics after ");
    return writer.cleanAndSaveModule(should_verify_module);
}